

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O3

CURLcode Curl_client_chop_write(connectdata *conn,int type,char *ptr,size_t len)

{
  Curl_easy *data;
  CURLcode CVar1;
  size_t sVar2;
  curl_write_callback p_Var3;
  char *fmt;
  curl_write_callback p_Var4;
  size_t sVar5;
  
  if (len == 0) {
    return CURLE_OK;
  }
  data = conn->data;
  if (((data->req).keepon & 0x10) != 0) {
LAB_005fe591:
    CVar1 = pausewrite(data,type,ptr,len);
    return CVar1;
  }
  if ((type & 1U) == 0) {
    p_Var4 = (curl_write_callback)0x0;
  }
  else {
    p_Var4 = (data->set).fwrite_func;
  }
  if ((type & 2U) != 0) {
    p_Var3 = (data->set).fwrite_header;
    if (p_Var3 != (curl_write_callback)0x0) goto LAB_005fe5e1;
    if ((data->set).writeheader != (void *)0x0) {
      p_Var3 = (data->set).fwrite_func;
      goto LAB_005fe5e1;
    }
  }
  p_Var3 = (curl_write_callback)0x0;
LAB_005fe5e1:
  do {
    sVar5 = 0x4000;
    if (len < 0x4000) {
      sVar5 = len;
    }
    if (p_Var4 != (curl_write_callback)0x0) {
      sVar2 = (*p_Var4)(ptr,1,sVar5,(data->set).out);
      if (sVar2 == 0x10000001) {
        if ((conn->handler->flags & 0x10) != 0) {
          fmt = "Write callback asked for PAUSE when not supported!";
          goto LAB_005fe6a0;
        }
        goto LAB_005fe591;
      }
      if (sVar2 != sVar5) {
        Curl_failf(data,"Failed writing body (%zu != %zu)",sVar2,sVar5);
        return CURLE_WRITE_ERROR;
      }
    }
    if (p_Var3 != (curl_write_callback)0x0) {
      sVar2 = (*p_Var3)(ptr,1,sVar5,(data->set).writeheader);
      if (sVar2 == 0x10000001) {
        type = 2;
        goto LAB_005fe591;
      }
      if (sVar2 != sVar5) {
        fmt = "Failed writing header";
LAB_005fe6a0:
        Curl_failf(data,fmt);
        return CURLE_WRITE_ERROR;
      }
    }
    ptr = ptr + sVar5;
    len = len - sVar5;
    if (len == 0) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

CURLcode Curl_client_chop_write(struct connectdata *conn,
                                int type,
                                char *ptr,
                                size_t len)
{
  struct Curl_easy *data = conn->data;
  curl_write_callback writeheader = NULL;
  curl_write_callback writebody = NULL;

  if(!len)
    return CURLE_OK;

  /* If reading is paused, append this data to the already held data for this
     type. */
  if(data->req.keepon & KEEP_RECV_PAUSE)
    return pausewrite(data, type, ptr, len);

  /* Determine the callback(s) to use. */
  if(type & CLIENTWRITE_BODY)
    writebody = data->set.fwrite_func;
  if((type & CLIENTWRITE_HEADER) &&
     (data->set.fwrite_header || data->set.writeheader)) {
    /*
     * Write headers to the same callback or to the especially setup
     * header callback function (added after version 7.7.1).
     */
    writeheader =
      data->set.fwrite_header? data->set.fwrite_header: data->set.fwrite_func;
  }

  /* Chop data, write chunks. */
  while(len) {
    size_t chunklen = len <= CURL_MAX_WRITE_SIZE? len: CURL_MAX_WRITE_SIZE;

    if(writebody) {
      size_t wrote = writebody(ptr, 1, chunklen, data->set.out);

      if(CURL_WRITEFUNC_PAUSE == wrote) {
        if(conn->handler->flags & PROTOPT_NONETWORK) {
          /* Protocols that work without network cannot be paused. This is
             actually only FILE:// just now, and it can't pause since the
             transfer isn't done using the "normal" procedure. */
          failf(data, "Write callback asked for PAUSE when not supported!");
          return CURLE_WRITE_ERROR;
        }
        return pausewrite(data, type, ptr, len);
      }
      if(wrote != chunklen) {
        failf(data, "Failed writing body (%zu != %zu)", wrote, chunklen);
        return CURLE_WRITE_ERROR;
      }
    }

    if(writeheader) {
      size_t wrote = writeheader(ptr, 1, chunklen, data->set.writeheader);

      if(CURL_WRITEFUNC_PAUSE == wrote)
        /* here we pass in the HEADER bit only since if this was body as well
           then it was passed already and clearly that didn't trigger the
           pause, so this is saved for later with the HEADER bit only */
        return pausewrite(data, CLIENTWRITE_HEADER, ptr, len);

      if(wrote != chunklen) {
        failf(data, "Failed writing header");
        return CURLE_WRITE_ERROR;
      }
    }

    ptr += chunklen;
    len -= chunklen;
  }

  return CURLE_OK;
}